

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O0

void __thiscall
QGraphicsProxyWidget::hoverMoveEvent(QGraphicsProxyWidget *this,QGraphicsSceneHoverEvent *event)

{
  bool bVar1;
  QGraphicsProxyWidgetPrivate *this_00;
  QWidget *this_01;
  QGraphicsSceneHoverEvent *in_RDI;
  long in_FS_OFFSET;
  QGraphicsProxyWidgetPrivate *d;
  QPointF *in_stack_00000088;
  QWidget *in_stack_00000090;
  QWidget *in_stack_00000098;
  QWidget *in_stack_ffffffffffffff78;
  QPointer<QWidget> *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff90;
  byte bVar2;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QGraphicsProxyWidget *)0x9bcf95);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9bcfab);
  bVar2 = 1;
  if (bVar1) {
    QGraphicsWidget::rect((QGraphicsWidget *)this_00);
    QGraphicsSceneHoverEvent::pos(in_RDI);
    bVar2 = QRectF::contains((QPointF *)local_28);
    bVar2 = bVar2 ^ 0xff;
  }
  if ((bVar2 & 1) == 0) {
    QPointer<QWidget>::operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    QGraphicsProxyWidgetPrivate::sendWidgetMouseEvent
              (this_00,(QGraphicsSceneHoverEvent *)CONCAT17(bVar2,in_stack_ffffffffffffff90));
  }
  else {
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9bd00f);
    if (bVar1) {
      this_01 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x9bd026);
      QGraphicsSceneHoverEvent::screenPos((QGraphicsSceneHoverEvent *)this_01);
      QPointF::QPointF((QPointF *)this_01,(QPoint *)in_stack_ffffffffffffff78);
      QApplicationPrivate::dispatchEnterLeave(in_stack_00000098,in_stack_00000090,in_stack_00000088)
      ;
      QPointer<QWidget>::operator=((QPointer<QWidget> *)this_01,in_stack_ffffffffffffff78);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsProxyWidget::hoverMoveEvent(QGraphicsSceneHoverEvent *event)
{
    Q_D(QGraphicsProxyWidget);
#ifdef GRAPHICSPROXYWIDGET_DEBUG
    qDebug("QGraphicsProxyWidget::hoverMoveEvent");
#endif
    // Ignore events on the window frame.
    if (!d->widget || !rect().contains(event->pos())) {
        if (d->lastWidgetUnderMouse) {
            QApplicationPrivate::dispatchEnterLeave(nullptr, d->lastWidgetUnderMouse, event->screenPos());
            d->lastWidgetUnderMouse = nullptr;
        }
        return;
    }

    d->embeddedMouseGrabber = nullptr;
    d->sendWidgetMouseEvent(event);
}